

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

void __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::run
          (PolarExtentCoreSimd<xsimd::avx> *this,PolarExtentCoreContext *ctx)

{
  long lVar1;
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> *in_RSI;
  PolarExtentCoreContext *in_RDI;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar12;
  get_bool_simd_register_t<float,_xsimd::avx> gVar4;
  simd_register<float,_xsimd::avx> sVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [40];
  undefined1 auVar9 [48];
  undefined8 uVar11;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  batch gain_1;
  size_t speaker_idx_2;
  extent_float_t *result_ptr;
  batch gain;
  size_t speaker_idx_1;
  size_t batch_i;
  bool all_ones;
  bool all_zeros;
  batch weight;
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> pos;
  size_t i;
  size_t speaker_idx;
  batch<float,_xsimd::avx> *in_stack_fffffffffffffce8;
  batch<float,_xsimd::avx> *in_stack_fffffffffffffcf0;
  undefined1 auVar13 [16];
  simd_register<float,_xsimd::avx> in_stack_fffffffffffffd00;
  register_type in_stack_fffffffffffffd20;
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> *in_stack_fffffffffffffd40;
  PolarExtentCoreContext *in_stack_fffffffffffffd48;
  PolarExtentCoreSimd<xsimd::avx> *in_stack_fffffffffffffd50;
  ulong local_2a8;
  batch<float,_xsimd::avx> local_280;
  batch<float,_xsimd::avx> *local_248;
  register_type local_240;
  ulong local_210;
  ulong local_208;
  batch_bool<float,_xsimd::avx> local_1e0;
  undefined1 local_1a1;
  batch_bool<float,_xsimd::avx> local_180;
  byte local_141;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_50;
  ulong local_48;
  PolarExtentCoreSimd<xsimd::avx> *in_stack_ffffffffffffffd0;
  
  for (local_48 = 0;
      local_48 < *(ulong *)((in_RSI->x).super_simd_register<float,_xsimd::avx>.data + 2);
      local_48 = local_48 + 1) {
    in_ZMM0 = ZEXT1664(ZEXT816(0) << 0x40);
    *(undefined4 *)
     (*(long *)(in_RSI[1].y.super_simd_register<float,_xsimd::avx>.data + 4) + local_48 * 4) = 0;
  }
  for (local_50 = 0; auVar10 = in_ZMM0._8_56_,
      local_50 < *(ulong *)(in_RSI->x).super_simd_register<float,_xsimd::avx>.data;
      local_50 = local_50 + 8) {
    xsimd::batch<float,_xsimd::avx>::load_aligned<float>((float *)in_stack_fffffffffffffcf0);
    auVar9 = auVar10._8_48_;
    local_e0._0_8_ = auVar10._0_8_;
    local_c0 = local_e0._0_8_;
    local_e0._8_8_ = auVar10._8_8_;
    local_b8 = local_e0._8_8_;
    local_e0._16_8_ = auVar10._16_8_;
    local_b0 = local_e0._16_8_;
    local_e0._24_8_ = auVar10._24_8_;
    local_a8 = local_e0._24_8_;
    local_e0 = auVar10._0_32_;
    xsimd::batch<float,_xsimd::avx>::load_aligned<float>((float *)in_stack_fffffffffffffcf0);
    auVar8 = auVar9._8_40_;
    local_100._0_8_ = auVar9._0_8_;
    local_a0 = local_100._0_8_;
    local_100._8_8_ = auVar9._8_8_;
    local_98 = local_100._8_8_;
    local_100._16_8_ = auVar9._16_8_;
    local_90 = local_100._16_8_;
    local_100._24_8_ = auVar9._24_8_;
    local_88 = local_100._24_8_;
    local_100 = auVar9._0_32_;
    xsimd::batch<float,_xsimd::avx>::load_aligned<float>((float *)in_stack_fffffffffffffcf0);
    auVar7 = auVar8._8_32_;
    local_120._0_8_ = auVar8._0_8_;
    local_80 = local_120._0_8_;
    local_120._8_8_ = auVar8._8_8_;
    local_78 = local_120._8_8_;
    local_120._16_8_ = auVar8._16_8_;
    local_70 = local_120._16_8_;
    local_120._24_8_ = auVar8._24_8_;
    local_68 = local_120._24_8_;
    local_120 = auVar8._0_32_;
    if (((uint)(in_RSI->z).super_simd_register<float,_xsimd::avx>.data[0] & 1) == 0) {
      weight_stadium(in_stack_ffffffffffffffd0,in_RDI,in_RSI);
      local_140 = auVar7;
    }
    else {
      weight_circle(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      local_140 = auVar7;
    }
    uVar3._0_4_ = 0.0;
    uVar3._4_4_ = 0.0;
    uVar6._0_4_ = 0.0;
    uVar6._4_4_ = 0.0;
    uVar11._0_4_ = 0.0;
    uVar11._4_4_ = 0.0;
    uVar12._0_4_ = 0.0;
    uVar12._4_4_ = 0.0;
    xsimd::batch<float,_xsimd::avx>::batch
              (in_stack_fffffffffffffd20._0_8_,in_stack_fffffffffffffd00.data[7]);
    xsimd::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_180.super_get_bool_simd_register_t<float,_xsimd::avx>.data._0_8_ = uVar3;
    local_180.super_get_bool_simd_register_t<float,_xsimd::avx>.data._8_8_ = uVar6;
    local_180.super_get_bool_simd_register_t<float,_xsimd::avx>.data._16_8_ = uVar11;
    local_180.super_get_bool_simd_register_t<float,_xsimd::avx>.data._24_8_ = uVar12;
    local_141 = xsimd::all<float,xsimd::avx>(&local_180);
    gVar4.data = SUB6432(ZEXT464(0x3f800000),0);
    xsimd::batch<float,_xsimd::avx>::batch
              (in_stack_fffffffffffffd20._0_8_,in_stack_fffffffffffffd00.data[7]);
    xsimd::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    in_ZMM0 = ZEXT1664(gVar4.data._0_16_);
    local_1e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data =
         (get_bool_simd_register_t<float,_xsimd::avx>)
         (get_bool_simd_register_t<float,_xsimd::avx>)gVar4.data;
    local_1a1 = xsimd::all<float,xsimd::avx>(&local_1e0);
    if ((bool)local_1a1) {
      local_208 = local_50 >> 3;
      for (local_210 = 0; sVar5.data = in_ZMM0._0_32_,
          local_210 < *(ulong *)((in_RSI->x).super_simd_register<float,_xsimd::avx>.data + 2);
          local_210 = local_210 + 8) {
        xsimd::batch<float,_xsimd::avx>::load_aligned<float>((float *)in_stack_fffffffffffffcf0);
        in_stack_fffffffffffffcf0 =
             (batch<float,_xsimd::avx> *)
             (*(long *)(in_RSI[1].y.super_simd_register<float,_xsimd::avx>.data + 4) + local_210 * 4
             );
        local_248 = in_stack_fffffffffffffcf0;
        local_240 = sVar5.data;
        xsimd::batch<float,_xsimd::avx>::load_aligned<float>((float *)in_stack_fffffffffffffcf0);
        xsimd::operator+(in_stack_fffffffffffffd00.data._16_8_,in_stack_fffffffffffffd00.data._8_8_)
        ;
        in_ZMM0 = ZEXT1664(sVar5.data._0_16_);
        local_280.super_simd_register<float,_xsimd::avx>.data =
             (simd_register<float,_xsimd::avx>)(simd_register<float,_xsimd::avx>)sVar5.data;
        xsimd::store_aligned<xsimd::avx,float>((float *)in_stack_fffffffffffffcf0,&local_280);
      }
    }
    else if ((local_141 & 1) == 0) {
      for (local_2a8 = 0; auVar13 = in_stack_fffffffffffffd00.data._8_16_,
          sVar5.data = in_ZMM0._0_32_,
          local_2a8 < *(ulong *)((in_RSI->x).super_simd_register<float,_xsimd::avx>.data + 4);
          local_2a8 = local_2a8 + 1) {
        xsimd::batch<float,_xsimd::avx>::load_aligned<float>((float *)in_stack_fffffffffffffcf0);
        in_stack_fffffffffffffd20 = sVar5.data;
        xsimd::operator*(auVar13._8_8_,auVar13._0_8_);
        fVar2 = xsimd::reduce_add<float,xsimd::avx>
                          ((batch<float,_xsimd::avx> *)&stack0xfffffffffffffd00);
        lVar1 = *(long *)(in_RSI[1].y.super_simd_register<float,_xsimd::avx>.data + 4);
        fVar2 = fVar2 + *(float *)(lVar1 + local_2a8 * 4);
        in_ZMM0 = ZEXT464((uint)fVar2);
        *(float *)(lVar1 + local_2a8 * 4) = fVar2;
        in_stack_fffffffffffffd00.data = sVar5.data;
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }